

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

Cba_Man_t * Cba_ManDeriveFromGia(Gia_Man_t *pGia,int fUseXor)

{
  Abc_Nam_t *pAVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int x;
  Cba_Man_t *p;
  Cba_Ntk_t *pNtk;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  
  p = Cba_ManAlloc(pGia->pSpec,1,(Abc_Nam_t *)0x0,(Abc_Nam_t *)0x0,(Abc_Nam_t *)0x0,
                   (Hash_IntMan_t *)0x0);
  iVar3 = Abc_NamStrFindOrAdd(p->pStrs,pGia->pName,(int *)0x0);
  pNtk = Cba_NtkAlloc(p,iVar3,pGia->vCis->nSize,pGia->vCos->nSize,1000,2000,2000);
  p_00 = Vec_IntStartFull(pGia->nObjs * 2);
  Cba_NtkAdd(p,pNtk);
  Cba_NtkCleanObjNames(pNtk);
  for (uVar10 = 0; (int)uVar10 < pGia->vCis->nSize; uVar10 = uVar10 + 1) {
    iVar3 = Vec_IntEntry(pGia->vCis,uVar10);
    pGVar7 = Gia_ManObj(pGia,iVar3);
    iVar3 = Gia_ObjId(pGia,pGVar7);
    if (iVar3 == 0) break;
    if (pGia->vNamesIn == (Vec_Ptr_t *)0x0) {
      iVar4 = Cba_NtkNewStrId(pNtk,"i%d",(ulong)uVar10);
    }
    else {
      pAVar1 = p->pStrs;
      pcVar8 = (char *)Vec_PtrEntry(pGia->vNamesIn,uVar10);
      iVar4 = Abc_NamStrFindOrAdd(pAVar1,pcVar8,(int *)0x0);
    }
    iVar5 = Cba_ObjAlloc(pNtk,CBA_OBJ_PI,0,1);
    Cba_ObjSetName(pNtk,iVar5,iVar4);
    iVar3 = Abc_Var2Lit(iVar3,0);
    iVar4 = Cba_ObjFon0(pNtk,iVar5);
    Vec_IntWriteEntry(p_00,iVar3,iVar4);
  }
  for (lVar9 = 0; iVar3 = (int)lVar9, lVar9 < pGia->nObjs; lVar9 = lVar9 + 1) {
    pGVar7 = Gia_ManObj(pGia,iVar3);
    if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
      pGVar7 = Gia_ManObj(pGia,iVar3);
      iVar4 = Gia_ObjFaninLit0(pGVar7,iVar3);
      uVar10 = (uint)((ulong)*(undefined8 *)pGVar7 >> 0x20);
      iVar5 = Abc_Var2Lit(iVar3 - (uVar10 & 0x1fffffff),uVar10 >> 0x1d & 1);
      iVar4 = Cba_NtkInsertGiaLit(pNtk,iVar4,p_00,fUseXor);
      iVar5 = Cba_NtkInsertGiaLit(pNtk,iVar5,p_00,fUseXor);
      iVar6 = Gia_ObjId(pGia,pGVar7);
      puVar2 = pGia->pMuxes;
      if ((puVar2 == (uint *)0x0) || (puVar2[iVar6] == 0)) {
        uVar10 = (uint)*(undefined8 *)pGVar7;
        if (((int)uVar10 < 0) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                        ,0x414,
                        "int Cba_NtkInsertGiaObj(Cba_Ntk_t *, Gia_Man_t *, int, Vec_Int_t *, int)");
        }
        iVar6 = Cba_ObjAlloc(pNtk,(uint)((uVar10 & 0x1fffffff) <
                                        ((uint)((ulong)*(undefined8 *)pGVar7 >> 0x20) & 0x1fffffff))
                                  * 4 + CBA_BOX_AND,2,1);
        Cba_ObjSetFinFon(pNtk,iVar6,0,iVar4);
        Cba_ObjSetFinFon(pNtk,iVar6,1,iVar5);
      }
      else {
        x = Cba_NtkInsertGiaLit(pNtk,-(uint)(puVar2[lVar9] == 0) | puVar2[lVar9],p_00,fUseXor);
        iVar6 = Cba_ObjAlloc(pNtk,CBA_BOX_MUX,3,1);
        Cba_ObjSetFinFon(pNtk,iVar6,0,x);
        Cba_ObjSetFinFon(pNtk,iVar6,1,iVar5);
        Cba_ObjSetFinFon(pNtk,iVar6,2,iVar4);
      }
      iVar3 = Abc_Var2Lit(iVar3,0);
      iVar4 = Cba_ObjFon0(pNtk,iVar6);
      Vec_IntWriteEntry(p_00,iVar3,iVar4);
    }
  }
  for (iVar3 = 0; iVar3 < pGia->vCos->nSize; iVar3 = iVar3 + 1) {
    pGVar7 = Gia_ManCo(pGia,iVar3);
    iVar4 = Gia_ObjId(pGia,pGVar7);
    if (iVar4 == 0) break;
    pGVar7 = Gia_ManObj(pGia,iVar4);
    iVar4 = Gia_ObjFaninLit0(pGVar7,iVar4);
    Cba_NtkInsertGiaLit(pNtk,iVar4,p_00,fUseXor);
  }
  for (uVar10 = 0; (int)uVar10 < pGia->vCos->nSize; uVar10 = uVar10 + 1) {
    pGVar7 = Gia_ManCo(pGia,uVar10);
    iVar3 = Gia_ObjId(pGia,pGVar7);
    if (iVar3 == 0) break;
    pGVar7 = Gia_ManObj(pGia,iVar3);
    iVar3 = Gia_ObjFaninLit0(pGVar7,iVar3);
    iVar3 = Cba_NtkInsertGiaLit(pNtk,iVar3,p_00,fUseXor);
    iVar4 = Cba_ObjAlloc(pNtk,CBA_BOX_BUF,1,1);
    Cba_ObjSetFinFon(pNtk,iVar4,0,iVar3);
    iVar3 = Cba_ObjFon0(pNtk,iVar4);
    if (pGia->vNamesOut == (Vec_Ptr_t *)0x0) {
      iVar4 = Cba_NtkNewStrId(pNtk,"o%d",(ulong)uVar10);
    }
    else {
      pAVar1 = p->pStrs;
      pcVar8 = (char *)Vec_PtrEntry(pGia->vNamesOut,uVar10);
      iVar4 = Abc_NamStrFindOrAdd(pAVar1,pcVar8,(int *)0x0);
    }
    iVar5 = Cba_ObjAlloc(pNtk,CBA_OBJ_PO,1,0);
    Cba_ObjSetName(pNtk,iVar5,iVar4);
    Cba_ObjSetFinFon(pNtk,iVar5,0,iVar3);
  }
  Cba_NtkCleanFonNames(pNtk);
  Cba_NtkCleanFonNames(pNtk);
  for (iVar3 = 0; iVar3 < (pNtk->vInputs).nSize; iVar3 = iVar3 + 1) {
    iVar4 = Vec_IntEntry(&pNtk->vInputs,iVar3);
    iVar5 = Cba_ObjFon0(pNtk,iVar4);
    iVar6 = Cba_FonName(pNtk,iVar5);
    if (iVar6 == 0) {
      iVar4 = Cba_ObjName(pNtk,iVar4);
      Cba_FonSetName(pNtk,iVar5,iVar4);
    }
  }
  for (iVar3 = 0; iVar3 < (pNtk->vOutputs).nSize; iVar3 = iVar3 + 1) {
    iVar4 = Vec_IntEntry(&pNtk->vOutputs,iVar3);
    iVar5 = Cba_ObjFinFon(pNtk,iVar4,0);
    if (0 < iVar5) {
      iVar6 = Cba_FonName(pNtk,iVar5);
      if (iVar6 == 0) {
        iVar4 = Cba_ObjName(pNtk,iVar4);
        Cba_FonSetName(pNtk,iVar5,iVar4);
      }
    }
  }
  Cba_NtkAddMissingFonNames(pNtk,"a");
  Vec_IntFree(p_00);
  return p;
}

Assistant:

Cba_Man_t * Cba_ManDeriveFromGia( Gia_Man_t * pGia, int fUseXor )
{
    Cba_Man_t * p = Cba_ManAlloc( pGia->pSpec, 1, NULL, NULL, NULL, NULL );
    Cba_Ntk_t * pNtk = Cba_NtkAlloc( p, Abc_NamStrFindOrAdd(p->pStrs, pGia->pName, NULL), Gia_ManCiNum(pGia), Gia_ManCoNum(pGia), 1000, 2000, 2000 );
    Vec_Int_t * vLit2Fon = Vec_IntStartFull( 2*Gia_ManObjNum(pGia) );
    int i, iObj, iObjNew, NameId, iLit0, iFon0;
    Gia_Obj_t * pObj;
    //Cba_ManPrepareTypeNames( p );
    Cba_NtkAdd( p, pNtk );
    Cba_NtkCleanObjNames( pNtk );
    Gia_ManForEachCiId( pGia, iObj, i )
    {
        NameId = pGia->vNamesIn? Abc_NamStrFindOrAdd(p->pStrs, (char*)Vec_PtrEntry(pGia->vNamesIn, i), NULL) : Cba_NtkNewStrId(pNtk, "i%d", i);
        iObjNew = Cba_ObjAlloc( pNtk, CBA_OBJ_PI, 0, 1 );
        Cba_ObjSetName( pNtk, iObjNew, NameId );
        Vec_IntWriteEntry( vLit2Fon, Abc_Var2Lit(iObj, 0), Cba_ObjFon0(pNtk, iObjNew) );
    }
    Gia_ManForEachAndId( pGia, iObj )
        Cba_NtkInsertGiaObj( pNtk, pGia, iObj, vLit2Fon, fUseXor );
    // create inverters if needed
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        pObj = Gia_ManObj( pGia, iObj );
        iLit0 = Gia_ObjFaninLit0( pObj, iObj );
        iFon0 = Cba_NtkInsertGiaLit( pNtk, iLit0, vLit2Fon, fUseXor ); // can be const!
    }
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        pObj = Gia_ManObj( pGia, iObj );
        iLit0 = Gia_ObjFaninLit0( pObj, iObj );
        iFon0 = Cba_NtkInsertGiaLit( pNtk, iLit0, vLit2Fon, fUseXor ); // can be const!
        iObjNew = Cba_ObjAlloc( pNtk, CBA_BOX_BUF, 1, 1 );
        Cba_ObjSetFinFon( pNtk, iObjNew, 0, iFon0 );
        iFon0 = Cba_ObjFon0(pNtk, iObjNew); // non-const fon unique for this output
        NameId = pGia->vNamesOut? Abc_NamStrFindOrAdd(p->pStrs, (char*)Vec_PtrEntry(pGia->vNamesOut, i), NULL) : Cba_NtkNewStrId(pNtk, "o%d", i);
        iObjNew = Cba_ObjAlloc( pNtk, CBA_OBJ_PO, 1, 0 );
        Cba_ObjSetName( pNtk, iObjNew, NameId );
        Cba_ObjSetFinFon( pNtk, iObjNew, 0, iFon0 );
    }
    Cba_NtkCleanFonNames( pNtk );
    Cba_NtkCreateFonNames( pNtk, "a" );
    Vec_IntFree( vLit2Fon );
    return p;
}